

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-flat-test.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_171e31::
InterfaceTester_QuadraticConstraint_QuadExprIsMultipliedOutAndInlined_Test::
InterfaceTester_QuadraticConstraint_QuadExprIsMultipliedOutAndInlined_Test
          (InterfaceTester_QuadraticConstraint_QuadExprIsMultipliedOutAndInlined_Test *this)

{
  undefined8 *in_RDI;
  InterfaceTesterWithBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
  *unaff_retaddr;
  
  InterfaceTesterWithBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
  ::InterfaceTesterWithBackendAcceptingConstraints(unaff_retaddr);
  *in_RDI = &
            PTR__InterfaceTester_QuadraticConstraint_QuadExprIsMultipliedOutAndInlined_Test_00969030
  ;
  return;
}

Assistant:

TEST_F(InterfaceTester_QuadraticConstraint, QuadExprIsMultipliedOutAndInlined) {
  auto modeler = mp::MakeEasyModeler(GetModel());
  auto x = modeler.AddVars(3, -1.0, 11.0);
  modeler.AddAlgCon(5.0,
                    (5*x[0]+3) * (6*x[1]+2) + x[2],
                    INFINITY);
  GetInterface().ConvertModel();
  const auto xi = modeler.GetVarIndices(x);
  auto lt = mp::LinTerms{ {10.0, 18.0, 1.0}, {xi[0], xi[1], xi[2]} };
  auto qt = mp::QuadTerms{ {30.0}, {xi[0]}, {xi[1]} };
  ASSERT_HAS_CONSTRAINT( GetBackend(), mp::QuadConRange(
    { std::move(lt), std::move(qt) },
    {-1.0, INFINITY} ) );
}